

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * CVmRun::get_named_args_from_frame(vm_val_t *fp,vm_val_t **arg0)

{
  int iVar1;
  ulong uVar2;
  vm_rcdesc *this;
  uchar *puVar3;
  vm_val_t *pvVar4;
  long *in_RSI;
  int argc;
  uchar *ip;
  vm_rcdesc *rc;
  uchar *ep;
  pool_ofs_t ofs;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  vm_rcdesc *in_stack_ffffffffffffffc8;
  uint local_1c;
  uchar *local_8;
  
  uVar2 = get_return_ofs_from_frame((vm_val_t *)0x214e98);
  local_1c = (uint)uVar2;
  local_8 = get_enclosing_entry_ptr_from_frame((vm_val_t *)0x214ea6);
  this = get_rcdesc_from_frame((vm_val_t *)0x214eb5);
  if ((local_1c == 0) && (this != (vm_rcdesc *)0x0)) {
    iVar1 = vm_rcdesc::has_return_addr(this);
    if (iVar1 != 0) {
      puVar3 = vm_rcdesc::get_return_addr(in_stack_ffffffffffffffc8);
      local_1c = (int)puVar3 - (int)local_8;
    }
  }
  if ((local_8 == (uchar *)0x0) || (local_1c == 0)) {
    local_8 = (uchar *)0x0;
  }
  else {
    local_8 = local_8 + local_1c;
    if (*local_8 == 'V') {
      iVar1 = ::osrp2(local_8 + 2);
      local_8 = local_8 + (iVar1 + 2);
    }
    if (*local_8 == 'W') {
      if (this == (vm_rcdesc *)0x0) {
        iVar1 = get_argc_from_frame((vm_val_t *)0x214f9e);
        pvVar4 = get_param_from_frame
                           ((vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
        *in_RSI = (long)pvVar4;
      }
      else {
        *in_RSI = (long)(this->argp + -(long)this->argc);
      }
      local_8 = local_8 + 3;
      iVar1 = ::osrp2(local_8);
      *in_RSI = *in_RSI + (long)(iVar1 + -1) * -0x10;
    }
    else {
      local_8 = (uchar *)0x0;
    }
  }
  return local_8;
}

Assistant:

const uchar *CVmRun::get_named_args_from_frame(
    VMG_ vm_val_t *fp, vm_val_t **arg0)
{
    /* get the return address */
    pool_ofs_t ofs = G_interpreter->get_return_ofs_from_frame(vmg_ fp);
    const uchar *ep =
        G_interpreter->get_enclosing_entry_ptr_from_frame(vmg_ fp);
    const vm_rcdesc *rc = G_interpreter->get_rcdesc_from_frame(vmg_ fp);

    /* check for a recursive native code caller */
    if (ofs == 0 && rc != 0 && rc->has_return_addr())
    {
        /* get the return address from the descriptor */
        ofs = rc->get_return_addr() - ep;
    }

    /* if there's no return address, there's no table */
    if (ep == 0 || ofs == 0)
        return 0;

    /* get the return instruction pointer */
    const uchar *ip = ep + ofs;
    
    /* if it's a NamedArgPtr instruction, follows the pointer */
    if (*ip == OPC_NAMEDARGPTR)
        ip += 2 + osrp2(ip+2);

    /* make sure we're at a NamedArgTab instruction */
    if (*ip == OPC_NAMEDARGTAB)
    {
        /* 
         *   We have a named argument table.  Fill in *arg0 with a pointer to
         *   the first named argument value in the stack frame.
         *   
         *   If there's a native caller at this level, get the arguments to
         *   the native caller instead of the arguments to the bytecode
         *   callee.  Native callers never send named arguments, so we can
         *   ignore the callee's arguments and look only at the native
         *   caller's arguments.  
         */
        int argc;
        if (rc != 0)
        {
            /* native caller - get the native code's arguments */
            argc = rc->argc;
            *arg0 = rc->argp - argc;
        }
        else
        {
            /* bytecode caller - get the current level's arguments */
            argc = G_interpreter->get_argc_from_frame(vmg_ fp);
            *arg0 = G_interpreter->get_param_from_frame(vmg_ fp, argc);
        }

        /* skip the NamedArgTab opcode and table length prefix */
        ip += 1 + 2;

        /* 
         *   Adjust arg0 for the number of arguments.  The compiler generates
         *   the names in the same order as the pushes, so the first name is
         *   the first value pushed. 
         */
        *arg0 -= (osrp2(ip) - 1);

        /* 
         *   return the table pointer - it starts after the NamedArgTab
         *   instruction and table byte length prefix 
         */
        return ip;
    }
    
    /* there's no named argument table in this return frame */
    return 0;
}